

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O1

void beltKeyExpand2(u32 *key_,octet *key,size_t len)

{
  uint uVar1;
  
  u32From(key_,key,len);
  if (len == 0x18) {
    key_[6] = key_[1] ^ *key_ ^ key_[2];
    uVar1 = key_[4] ^ key_[3] ^ key_[5];
  }
  else {
    if (len != 0x10) {
      return;
    }
    *(undefined8 *)(key_ + 4) = *(undefined8 *)key_;
    key_[6] = key_[2];
    uVar1 = key_[3];
  }
  key_[7] = uVar1;
  return;
}

Assistant:

void beltKeyExpand2(u32 key_[8], const octet key[], size_t len)
{
	ASSERT(memIsValid(key_, 32));
	ASSERT(len == 16 || len == 24 || len == 32);
	ASSERT(memIsValid(key, len));
	u32From(key_, key, len);
	if (len == 16)
	{
		key_[4] = key_[0];
		key_[5] = key_[1];
		key_[6] = key_[2];
		key_[7] = key_[3];
	}
	else if (len == 24)
	{
		key_[6] = key_[0] ^ key_[1] ^ key_[2];
		key_[7] = key_[3] ^ key_[4] ^ key_[5];
	}
}